

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O2

void __thiscall
embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
          (CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
          *patch)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  vfloat_impl<4> *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t i_1;
  ulong uVar9;
  long lVar10;
  vfloat_impl<4> *pvVar11;
  float *pfVar12;
  vfloat_impl<4> *pvVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  size_t i;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  vfloat_impl<4> center_ring [8];
  
  patch->items[0].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].vertex_level = (this->ring).items[0].vertex_level * 0.5;
  patch->items[0].ring.items[0].face_valence = (this->ring).items[0].face_valence;
  patch->items[0].ring.items[0].edge_valence = (this->ring).items[0].edge_valence;
  patch->items[0].ring.items[0].border_index = (this->ring).items[0].border_index;
  fVar22 = (this->ring).items[0].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[0].ring.items[0].vertex_crease_weight = fVar22;
  patch->items[0].ring.items[0].eval_start_index = (this->ring).items[0].eval_start_index;
  patch->items[0].ring.items[0].eval_unique_identifier =
       (this->ring).items[0].eval_unique_identifier;
  pDVar2 = &patch->items[0].ring.items[0].ring;
  fVar22 = 0.0;
  fVar28 = 0.0;
  fVar29 = 0.0;
  fVar30 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[0].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[0].edge_valence;
    uVar15 = (this->ring).items[0].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pvVar6 = (this->ring).items[0].ring.data;
    pvVar11 = pvVar6 + lVar10;
    pvVar13 = pvVar6 + (lVar16 * 2 - uVar9);
    pvVar6 = pvVar6 + (uVar15 - uVar14);
    fVar24 = ((pvVar13->field_0).v[0] + (pvVar6->field_0).v[0] +
             (this->ring).items[0].vtx.field_0.v[0] + (pvVar11->field_0).v[0]) * 0.25;
    fVar25 = ((pvVar13->field_0).v[1] + (pvVar6->field_0).v[1] +
             (this->ring).items[0].vtx.field_0.v[1] + (pvVar11->field_0).v[1]) * 0.25;
    fVar26 = ((pvVar13->field_0).v[2] + (pvVar6->field_0).v[2] +
             (this->ring).items[0].vtx.field_0.v[2] + (pvVar11->field_0).v[2]) * 0.25;
    fVar27 = ((pvVar13->field_0).v[3] + (pvVar6->field_0).v[3] +
             (this->ring).items[0].vtx.field_0.v[3] + (pvVar11->field_0).v[3]) * 0.25;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[0].ring.items[0].ring.data = pvVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[0].ring.items[0].ring.data;
    }
    pvVar11 = pvVar11 + lVar10;
    (pvVar11->field_0).v[0] = fVar24;
    (pvVar11->field_0).v[1] = fVar25;
    (pvVar11->field_0).v[2] = fVar26;
    (pvVar11->field_0).v[3] = fVar27;
    fVar22 = fVar22 + fVar24;
    fVar28 = fVar28 + fVar25;
    fVar29 = fVar29 + fVar26;
    fVar30 = fVar30 + fVar27;
  }
  pDVar1 = &patch->items[0].ring.items[0].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar8 = center_ring[0].field_0._8_8_, uVar7 = center_ring[0].field_0._0_8_,
      uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[0].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar24 = (this->ring).items[0].crease_weight.data[lVar16];
    pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[0].ring.items[0].crease_weight.data[lVar10] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    }
    fVar25 = 0.0;
    if (0.0 <= fVar24 + -1.0) {
      fVar25 = fVar24 + -1.0;
    }
    pfVar12[lVar16] = fVar25;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[0].edge_valence - 1);
    }
    pvVar11 = (this->ring).items[0].ring.data + lVar16 * 2;
    fVar25 = (this->ring).items[0].vtx.field_0.v[0] + (pvVar11->field_0).v[0];
    fVar26 = (this->ring).items[0].vtx.field_0.v[1] + (pvVar11->field_0).v[1];
    fVar27 = (this->ring).items[0].vtx.field_0.v[2] + (pvVar11->field_0).v[2];
    fVar23 = (this->ring).items[0].vtx.field_0.v[3] + (pvVar11->field_0).v[3];
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    if ((0x20 < uVar9 + 1) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[0].ring.items[0].ring.data = pvVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[0].ring.items[0].ring.data;
    }
    pvVar13 = pvVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar13 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[0].ring.items[0].ring.data = pvVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar13 = patch->items[0].ring.items[0].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pvVar11 = pvVar11 + uVar9;
    pvVar6 = pvVar13 + uVar14;
    fVar31 = (pvVar11->field_0).v[0] + (pvVar6->field_0).v[0];
    fVar32 = (pvVar11->field_0).v[1] + (pvVar6->field_0).v[1];
    fVar33 = (pvVar11->field_0).v[2] + (pvVar6->field_0).v[2];
    fVar34 = (pvVar11->field_0).v[3] + (pvVar6->field_0).v[3];
    pvVar11 = (this->ring).items[0].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pvVar11->field_0).v[0];
    fVar28 = fVar28 + (pvVar11->field_0).v[1];
    fVar29 = fVar29 + (pvVar11->field_0).v[2];
    fVar30 = fVar30 + (pvVar11->field_0).v[3];
    if (0.0 < fVar24) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[0].ring.items[0].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[0].ring.items[0].ring.data;
      }
      uVar21 = uVar21 + 1;
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = fVar25 * 0.5;
      (pvVar13->field_0).v[1] = fVar26 * 0.5;
      (pvVar13->field_0).v[2] = fVar27 * 0.5;
      (pvVar13->field_0).v[3] = fVar23 * 0.5;
      if (fVar24 < 1.0) {
        fVar31 = (fVar25 + fVar31) * 0.25;
        fVar32 = (fVar26 + fVar32) * 0.25;
        fVar33 = (fVar27 + fVar33) * 0.25;
        fVar34 = (fVar23 + fVar34) * 0.25;
        fStack_284 = (fVar26 * 0.5 - fVar32) * fVar24 + fVar32;
        local_288 = (fVar25 * 0.5 - fVar31) * fVar24 + fVar31;
        fStack_280 = (fVar27 * 0.5 - fVar33) * fVar24 + fVar33;
        fStack_27c = (fVar23 * 0.5 - fVar34) * fVar24 + fVar34;
        pvVar13 = patch->items[0].ring.items[0].ring.data;
        if ((0x20 < uVar14) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
          pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[0].ring.items[0].ring.data = pvVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pvVar13 = patch->items[0].ring.items[0].ring.data;
        }
        goto LAB_005c2c59;
      }
    }
    else {
      local_288 = (fVar25 + fVar31) * 0.25;
      fStack_284 = (fVar26 + fVar32) * 0.25;
      fStack_280 = (fVar27 + fVar33) * 0.25;
      fStack_27c = (fVar23 + fVar34) * 0.25;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[0].ring.items[0].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[0].ring.items[0].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[0].ring.items[0].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[0].ring.items[0].ring.data;
LAB_005c2c59:
      }
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = local_288;
      (pvVar13->field_0).v[1] = fStack_284;
      (pvVar13->field_0).v[2] = fStack_280;
      (pvVar13->field_0).v[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[0].face_valence;
  }
  fVar25 = 1.0 / (float)uVar9;
  fVar24 = (float)uVar9 + -2.0;
  fVar26 = (fVar22 * fVar25 + fVar24 * (this->ring).items[0].vtx.field_0.v[0]) * fVar25;
  fVar28 = (fVar28 * fVar25 + fVar24 * (this->ring).items[0].vtx.field_0.v[1]) * fVar25;
  fVar29 = (fVar29 * fVar25 + fVar24 * (this->ring).items[0].vtx.field_0.v[2]) * fVar25;
  fVar25 = (fVar30 * fVar25 + fVar24 * (this->ring).items[0].vtx.field_0.v[3]) * fVar25;
  patch->items[0].ring.items[0].vtx.field_0.v[0] = fVar26;
  patch->items[0].ring.items[0].vtx.field_0.v[1] = fVar28;
  patch->items[0].ring.items[0].vtx.field_0.v[2] = fVar29;
  patch->items[0].ring.items[0].vtx.field_0.v[3] = fVar25;
  fVar22 = (this->ring).items[0].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005c5f60:
      fVar30 = (this->ring).items[0].vtx.field_0.v[0];
      fVar24 = (this->ring).items[0].vtx.field_0.v[1];
      fVar27 = (this->ring).items[0].vtx.field_0.v[2];
      fVar22 = (this->ring).items[0].vtx.field_0.v[3];
    }
    else {
      fVar30 = ((this->ring).items[0].vtx.field_0.v[0] - fVar26) * fVar22;
      fVar24 = ((this->ring).items[0].vtx.field_0.v[1] - fVar28) * fVar22;
      fVar27 = ((this->ring).items[0].vtx.field_0.v[2] - fVar29) * fVar22;
      fVar22 = ((this->ring).items[0].vtx.field_0.v[3] - fVar25) * fVar22;
LAB_005c5aa7:
      fVar30 = fVar30 + fVar26;
      fVar24 = fVar24 + fVar28;
      fVar27 = fVar27 + fVar29;
      fVar22 = fVar22 + fVar25;
    }
    patch->items[0].ring.items[0].vtx.field_0.v[0] = fVar30;
    patch->items[0].ring.items[0].vtx.field_0.v[1] = fVar24;
    patch->items[0].ring.items[0].vtx.field_0.v[2] = fVar27;
    patch->items[0].ring.items[0].vtx.field_0.v[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005c5f60;
    pvVar13 = (this->ring).items[0].ring.data;
    pvVar11 = pvVar13 + center_ring[0].field_0._0_8_ * 2;
    pvVar13 = pvVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar23 = ((this->ring).items[0].vtx.field_0.v[0] * 6.0 + (pvVar11->field_0).v[0] +
             (pvVar13->field_0).v[0]) * 0.125;
    fVar31 = ((this->ring).items[0].vtx.field_0.v[1] * 6.0 + (pvVar11->field_0).v[1] +
             (pvVar13->field_0).v[1]) * 0.125;
    fVar32 = ((this->ring).items[0].vtx.field_0.v[2] * 6.0 + (pvVar11->field_0).v[2] +
             (pvVar13->field_0).v[2]) * 0.125;
    fVar33 = ((this->ring).items[0].vtx.field_0.v[3] * 6.0 + (pvVar11->field_0).v[3] +
             (pvVar13->field_0).v[3]) * 0.125;
    patch->items[0].ring.items[0].vtx.field_0.v[0] = fVar23;
    patch->items[0].ring.items[0].vtx.field_0.v[1] = fVar31;
    patch->items[0].ring.items[0].vtx.field_0.v[2] = fVar32;
    patch->items[0].ring.items[0].vtx.field_0.v[3] = fVar33;
    pfVar12 = (this->ring).items[0].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar30 = pfVar12[center_ring[0].field_0._8_8_];
    fVar27 = (fVar22 * 3.0 + fVar30) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[0].ring.items[0].crease_weight.data[lVar16] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    }
    pfVar12[uVar7] = fVar24;
    fVar27 = (fVar30 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    if ((0x10 < uVar8 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[0].ring.items[0].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[0].ring.items[0].crease_weight.data[lVar16] =
             patch->items[0].ring.items[0].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[0].ring.items[0].crease_weight.data;
    }
    pfVar12[uVar8] = fVar24;
    fVar22 = (fVar22 + fVar30) * 0.5;
    if (fVar22 < 1.0) {
      fVar30 = (fVar23 - fVar26) * fVar22;
      fVar24 = (fVar31 - fVar28) * fVar22;
      fVar27 = (fVar32 - fVar29) * fVar22;
      fVar22 = (fVar33 - fVar25) * fVar22;
      goto LAB_005c5aa7;
    }
  }
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[1].vertex_level = (this->ring).items[1].vertex_level * 0.5;
  patch->items[1].ring.items[1].face_valence = (this->ring).items[1].face_valence;
  patch->items[1].ring.items[1].edge_valence = (this->ring).items[1].edge_valence;
  patch->items[1].ring.items[1].border_index = (this->ring).items[1].border_index;
  fVar22 = (this->ring).items[1].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[1].ring.items[1].vertex_crease_weight = fVar22;
  patch->items[1].ring.items[1].eval_start_index = (this->ring).items[1].eval_start_index;
  patch->items[1].ring.items[1].eval_unique_identifier =
       (this->ring).items[1].eval_unique_identifier;
  pDVar2 = &patch->items[1].ring.items[1].ring;
  fVar22 = 0.0;
  fVar28 = 0.0;
  fVar29 = 0.0;
  fVar30 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[1].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[1].edge_valence;
    uVar15 = (this->ring).items[1].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pvVar6 = (this->ring).items[1].ring.data;
    pvVar11 = pvVar6 + lVar10;
    pvVar13 = pvVar6 + (lVar16 * 2 - uVar9);
    pvVar6 = pvVar6 + (uVar15 - uVar14);
    fVar24 = ((pvVar13->field_0).v[0] + (pvVar6->field_0).v[0] +
             (this->ring).items[1].vtx.field_0.v[0] + (pvVar11->field_0).v[0]) * 0.25;
    fVar25 = ((pvVar13->field_0).v[1] + (pvVar6->field_0).v[1] +
             (this->ring).items[1].vtx.field_0.v[1] + (pvVar11->field_0).v[1]) * 0.25;
    fVar26 = ((pvVar13->field_0).v[2] + (pvVar6->field_0).v[2] +
             (this->ring).items[1].vtx.field_0.v[2] + (pvVar11->field_0).v[2]) * 0.25;
    fVar27 = ((pvVar13->field_0).v[3] + (pvVar6->field_0).v[3] +
             (this->ring).items[1].vtx.field_0.v[3] + (pvVar11->field_0).v[3]) * 0.25;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[1].ring.items[1].ring.data = pvVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[1].ring.items[1].ring.data;
    }
    pvVar11 = pvVar11 + lVar10;
    (pvVar11->field_0).v[0] = fVar24;
    (pvVar11->field_0).v[1] = fVar25;
    (pvVar11->field_0).v[2] = fVar26;
    (pvVar11->field_0).v[3] = fVar27;
    fVar22 = fVar22 + fVar24;
    fVar28 = fVar28 + fVar25;
    fVar29 = fVar29 + fVar26;
    fVar30 = fVar30 + fVar27;
  }
  pDVar1 = &patch->items[1].ring.items[1].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar8 = center_ring[0].field_0._8_8_, uVar7 = center_ring[0].field_0._0_8_,
      uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[1].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar24 = (this->ring).items[1].crease_weight.data[lVar16];
    pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[1].ring.items[1].crease_weight.data[lVar10] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    }
    fVar25 = 0.0;
    if (0.0 <= fVar24 + -1.0) {
      fVar25 = fVar24 + -1.0;
    }
    pfVar12[lVar16] = fVar25;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[1].edge_valence - 1);
    }
    pvVar11 = (this->ring).items[1].ring.data + lVar16 * 2;
    fVar25 = (this->ring).items[1].vtx.field_0.v[0] + (pvVar11->field_0).v[0];
    fVar26 = (this->ring).items[1].vtx.field_0.v[1] + (pvVar11->field_0).v[1];
    fVar27 = (this->ring).items[1].vtx.field_0.v[2] + (pvVar11->field_0).v[2];
    fVar23 = (this->ring).items[1].vtx.field_0.v[3] + (pvVar11->field_0).v[3];
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    if ((0x20 < uVar9 + 1) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[1].ring.items[1].ring.data = pvVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[1].ring.items[1].ring.data;
    }
    pvVar13 = pvVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar13 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[1].ring.items[1].ring.data = pvVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar13 = patch->items[1].ring.items[1].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pvVar11 = pvVar11 + uVar9;
    pvVar6 = pvVar13 + uVar14;
    fVar31 = (pvVar11->field_0).v[0] + (pvVar6->field_0).v[0];
    fVar32 = (pvVar11->field_0).v[1] + (pvVar6->field_0).v[1];
    fVar33 = (pvVar11->field_0).v[2] + (pvVar6->field_0).v[2];
    fVar34 = (pvVar11->field_0).v[3] + (pvVar6->field_0).v[3];
    pvVar11 = (this->ring).items[1].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pvVar11->field_0).v[0];
    fVar28 = fVar28 + (pvVar11->field_0).v[1];
    fVar29 = fVar29 + (pvVar11->field_0).v[2];
    fVar30 = fVar30 + (pvVar11->field_0).v[3];
    if (0.0 < fVar24) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[1].ring.items[1].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[1].ring.items[1].ring.data;
      }
      uVar21 = uVar21 + 1;
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = fVar25 * 0.5;
      (pvVar13->field_0).v[1] = fVar26 * 0.5;
      (pvVar13->field_0).v[2] = fVar27 * 0.5;
      (pvVar13->field_0).v[3] = fVar23 * 0.5;
      if (fVar24 < 1.0) {
        fVar31 = (fVar25 + fVar31) * 0.25;
        fVar32 = (fVar26 + fVar32) * 0.25;
        fVar33 = (fVar27 + fVar33) * 0.25;
        fVar34 = (fVar23 + fVar34) * 0.25;
        fStack_284 = (fVar26 * 0.5 - fVar32) * fVar24 + fVar32;
        local_288 = (fVar25 * 0.5 - fVar31) * fVar24 + fVar31;
        fStack_280 = (fVar27 * 0.5 - fVar33) * fVar24 + fVar33;
        fStack_27c = (fVar23 * 0.5 - fVar34) * fVar24 + fVar34;
        pvVar13 = patch->items[1].ring.items[1].ring.data;
        if ((0x20 < uVar14) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
          pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[1].ring.items[1].ring.data = pvVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pvVar13 = patch->items[1].ring.items[1].ring.data;
        }
        goto LAB_005c3467;
      }
    }
    else {
      local_288 = (fVar25 + fVar31) * 0.25;
      fStack_284 = (fVar26 + fVar32) * 0.25;
      fStack_280 = (fVar27 + fVar33) * 0.25;
      fStack_27c = (fVar23 + fVar34) * 0.25;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[1].ring.items[1].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[1].ring.items[1].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[1].ring.items[1].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[1].ring.items[1].ring.data;
LAB_005c3467:
      }
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = local_288;
      (pvVar13->field_0).v[1] = fStack_284;
      (pvVar13->field_0).v[2] = fStack_280;
      (pvVar13->field_0).v[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[1].face_valence;
  }
  fVar25 = 1.0 / (float)uVar9;
  fVar24 = (float)uVar9 + -2.0;
  fVar26 = (fVar22 * fVar25 + fVar24 * (this->ring).items[1].vtx.field_0.v[0]) * fVar25;
  fVar28 = (fVar28 * fVar25 + fVar24 * (this->ring).items[1].vtx.field_0.v[1]) * fVar25;
  fVar29 = (fVar29 * fVar25 + fVar24 * (this->ring).items[1].vtx.field_0.v[2]) * fVar25;
  fVar25 = (fVar30 * fVar25 + fVar24 * (this->ring).items[1].vtx.field_0.v[3]) * fVar25;
  patch->items[1].ring.items[1].vtx.field_0.v[0] = fVar26;
  patch->items[1].ring.items[1].vtx.field_0.v[1] = fVar28;
  patch->items[1].ring.items[1].vtx.field_0.v[2] = fVar29;
  patch->items[1].ring.items[1].vtx.field_0.v[3] = fVar25;
  fVar22 = (this->ring).items[1].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005c5f74:
      fVar30 = (this->ring).items[1].vtx.field_0.v[0];
      fVar24 = (this->ring).items[1].vtx.field_0.v[1];
      fVar27 = (this->ring).items[1].vtx.field_0.v[2];
      fVar22 = (this->ring).items[1].vtx.field_0.v[3];
    }
    else {
      fVar30 = ((this->ring).items[1].vtx.field_0.v[0] - fVar26) * fVar22;
      fVar24 = ((this->ring).items[1].vtx.field_0.v[1] - fVar28) * fVar22;
      fVar27 = ((this->ring).items[1].vtx.field_0.v[2] - fVar29) * fVar22;
      fVar22 = ((this->ring).items[1].vtx.field_0.v[3] - fVar25) * fVar22;
LAB_005c5ace:
      fVar30 = fVar30 + fVar26;
      fVar24 = fVar24 + fVar28;
      fVar27 = fVar27 + fVar29;
      fVar22 = fVar22 + fVar25;
    }
    patch->items[1].ring.items[1].vtx.field_0.v[0] = fVar30;
    patch->items[1].ring.items[1].vtx.field_0.v[1] = fVar24;
    patch->items[1].ring.items[1].vtx.field_0.v[2] = fVar27;
    patch->items[1].ring.items[1].vtx.field_0.v[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005c5f74;
    pvVar13 = (this->ring).items[1].ring.data;
    pvVar11 = pvVar13 + center_ring[0].field_0._0_8_ * 2;
    pvVar13 = pvVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar23 = ((this->ring).items[1].vtx.field_0.v[0] * 6.0 + (pvVar11->field_0).v[0] +
             (pvVar13->field_0).v[0]) * 0.125;
    fVar31 = ((this->ring).items[1].vtx.field_0.v[1] * 6.0 + (pvVar11->field_0).v[1] +
             (pvVar13->field_0).v[1]) * 0.125;
    fVar32 = ((this->ring).items[1].vtx.field_0.v[2] * 6.0 + (pvVar11->field_0).v[2] +
             (pvVar13->field_0).v[2]) * 0.125;
    fVar33 = ((this->ring).items[1].vtx.field_0.v[3] * 6.0 + (pvVar11->field_0).v[3] +
             (pvVar13->field_0).v[3]) * 0.125;
    patch->items[1].ring.items[1].vtx.field_0.v[0] = fVar23;
    patch->items[1].ring.items[1].vtx.field_0.v[1] = fVar31;
    patch->items[1].ring.items[1].vtx.field_0.v[2] = fVar32;
    patch->items[1].ring.items[1].vtx.field_0.v[3] = fVar33;
    pfVar12 = (this->ring).items[1].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar30 = pfVar12[center_ring[0].field_0._8_8_];
    fVar27 = (fVar22 * 3.0 + fVar30) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[1].ring.items[1].crease_weight.data[lVar16] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    }
    pfVar12[uVar7] = fVar24;
    fVar27 = (fVar30 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    if ((0x10 < uVar8 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[1].ring.items[1].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[1].ring.items[1].crease_weight.data[lVar16] =
             patch->items[1].ring.items[1].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[1].ring.items[1].crease_weight.data;
    }
    pfVar12[uVar8] = fVar24;
    fVar22 = (fVar22 + fVar30) * 0.5;
    if (fVar22 < 1.0) {
      fVar30 = (fVar23 - fVar26) * fVar22;
      fVar24 = (fVar31 - fVar28) * fVar22;
      fVar27 = (fVar32 - fVar29) * fVar22;
      fVar22 = (fVar33 - fVar25) * fVar22;
      goto LAB_005c5ace;
    }
  }
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[2].vertex_level = (this->ring).items[2].vertex_level * 0.5;
  patch->items[2].ring.items[2].face_valence = (this->ring).items[2].face_valence;
  patch->items[2].ring.items[2].edge_valence = (this->ring).items[2].edge_valence;
  patch->items[2].ring.items[2].border_index = (this->ring).items[2].border_index;
  fVar22 = (this->ring).items[2].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[2].ring.items[2].vertex_crease_weight = fVar22;
  patch->items[2].ring.items[2].eval_start_index = (this->ring).items[2].eval_start_index;
  patch->items[2].ring.items[2].eval_unique_identifier =
       (this->ring).items[2].eval_unique_identifier;
  pDVar2 = &patch->items[2].ring.items[2].ring;
  fVar22 = 0.0;
  fVar28 = 0.0;
  fVar29 = 0.0;
  fVar30 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[2].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[2].edge_valence;
    uVar15 = (this->ring).items[2].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pvVar6 = (this->ring).items[2].ring.data;
    pvVar11 = pvVar6 + lVar10;
    pvVar13 = pvVar6 + (lVar16 * 2 - uVar9);
    pvVar6 = pvVar6 + (uVar15 - uVar14);
    fVar24 = ((pvVar13->field_0).v[0] + (pvVar6->field_0).v[0] +
             (this->ring).items[2].vtx.field_0.v[0] + (pvVar11->field_0).v[0]) * 0.25;
    fVar25 = ((pvVar13->field_0).v[1] + (pvVar6->field_0).v[1] +
             (this->ring).items[2].vtx.field_0.v[1] + (pvVar11->field_0).v[1]) * 0.25;
    fVar26 = ((pvVar13->field_0).v[2] + (pvVar6->field_0).v[2] +
             (this->ring).items[2].vtx.field_0.v[2] + (pvVar11->field_0).v[2]) * 0.25;
    fVar27 = ((pvVar13->field_0).v[3] + (pvVar6->field_0).v[3] +
             (this->ring).items[2].vtx.field_0.v[3] + (pvVar11->field_0).v[3]) * 0.25;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[2].ring.items[2].ring.data = pvVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[2].ring.items[2].ring.data;
    }
    pvVar11 = pvVar11 + lVar10;
    (pvVar11->field_0).v[0] = fVar24;
    (pvVar11->field_0).v[1] = fVar25;
    (pvVar11->field_0).v[2] = fVar26;
    (pvVar11->field_0).v[3] = fVar27;
    fVar22 = fVar22 + fVar24;
    fVar28 = fVar28 + fVar25;
    fVar29 = fVar29 + fVar26;
    fVar30 = fVar30 + fVar27;
  }
  pDVar1 = &patch->items[2].ring.items[2].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar8 = center_ring[0].field_0._8_8_, uVar7 = center_ring[0].field_0._0_8_,
      uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[2].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar24 = (this->ring).items[2].crease_weight.data[lVar16];
    pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[2].ring.items[2].crease_weight.data[lVar10] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    }
    fVar25 = 0.0;
    if (0.0 <= fVar24 + -1.0) {
      fVar25 = fVar24 + -1.0;
    }
    pfVar12[lVar16] = fVar25;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[2].edge_valence - 1);
    }
    pvVar11 = (this->ring).items[2].ring.data + lVar16 * 2;
    fVar25 = (this->ring).items[2].vtx.field_0.v[0] + (pvVar11->field_0).v[0];
    fVar26 = (this->ring).items[2].vtx.field_0.v[1] + (pvVar11->field_0).v[1];
    fVar27 = (this->ring).items[2].vtx.field_0.v[2] + (pvVar11->field_0).v[2];
    fVar23 = (this->ring).items[2].vtx.field_0.v[3] + (pvVar11->field_0).v[3];
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    if ((0x20 < uVar9 + 1) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[2].ring.items[2].ring.data = pvVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[2].ring.items[2].ring.data;
    }
    pvVar13 = pvVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar13 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[2].ring.items[2].ring.data = pvVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar13 = patch->items[2].ring.items[2].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pvVar11 = pvVar11 + uVar9;
    pvVar6 = pvVar13 + uVar14;
    fVar31 = (pvVar11->field_0).v[0] + (pvVar6->field_0).v[0];
    fVar32 = (pvVar11->field_0).v[1] + (pvVar6->field_0).v[1];
    fVar33 = (pvVar11->field_0).v[2] + (pvVar6->field_0).v[2];
    fVar34 = (pvVar11->field_0).v[3] + (pvVar6->field_0).v[3];
    pvVar11 = (this->ring).items[2].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pvVar11->field_0).v[0];
    fVar28 = fVar28 + (pvVar11->field_0).v[1];
    fVar29 = fVar29 + (pvVar11->field_0).v[2];
    fVar30 = fVar30 + (pvVar11->field_0).v[3];
    if (0.0 < fVar24) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[2].ring.items[2].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[2].ring.items[2].ring.data;
      }
      uVar21 = uVar21 + 1;
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = fVar25 * 0.5;
      (pvVar13->field_0).v[1] = fVar26 * 0.5;
      (pvVar13->field_0).v[2] = fVar27 * 0.5;
      (pvVar13->field_0).v[3] = fVar23 * 0.5;
      if (fVar24 < 1.0) {
        fVar31 = (fVar25 + fVar31) * 0.25;
        fVar32 = (fVar26 + fVar32) * 0.25;
        fVar33 = (fVar27 + fVar33) * 0.25;
        fVar34 = (fVar23 + fVar34) * 0.25;
        fStack_284 = (fVar26 * 0.5 - fVar32) * fVar24 + fVar32;
        local_288 = (fVar25 * 0.5 - fVar31) * fVar24 + fVar31;
        fStack_280 = (fVar27 * 0.5 - fVar33) * fVar24 + fVar33;
        fStack_27c = (fVar23 * 0.5 - fVar34) * fVar24 + fVar34;
        pvVar13 = patch->items[2].ring.items[2].ring.data;
        if ((0x20 < uVar14) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
          pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[2].ring.items[2].ring.data = pvVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pvVar13 = patch->items[2].ring.items[2].ring.data;
        }
        goto LAB_005c3c78;
      }
    }
    else {
      local_288 = (fVar25 + fVar31) * 0.25;
      fStack_284 = (fVar26 + fVar32) * 0.25;
      fStack_280 = (fVar27 + fVar33) * 0.25;
      fStack_27c = (fVar23 + fVar34) * 0.25;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[2].ring.items[2].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[2].ring.items[2].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[2].ring.items[2].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[2].ring.items[2].ring.data;
LAB_005c3c78:
      }
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = local_288;
      (pvVar13->field_0).v[1] = fStack_284;
      (pvVar13->field_0).v[2] = fStack_280;
      (pvVar13->field_0).v[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[2].face_valence;
  }
  fVar25 = 1.0 / (float)uVar9;
  fVar24 = (float)uVar9 + -2.0;
  fVar26 = (fVar22 * fVar25 + fVar24 * (this->ring).items[2].vtx.field_0.v[0]) * fVar25;
  fVar28 = (fVar28 * fVar25 + fVar24 * (this->ring).items[2].vtx.field_0.v[1]) * fVar25;
  fVar29 = (fVar29 * fVar25 + fVar24 * (this->ring).items[2].vtx.field_0.v[2]) * fVar25;
  fVar25 = (fVar30 * fVar25 + fVar24 * (this->ring).items[2].vtx.field_0.v[3]) * fVar25;
  patch->items[2].ring.items[2].vtx.field_0.v[0] = fVar26;
  patch->items[2].ring.items[2].vtx.field_0.v[1] = fVar28;
  patch->items[2].ring.items[2].vtx.field_0.v[2] = fVar29;
  patch->items[2].ring.items[2].vtx.field_0.v[3] = fVar25;
  fVar22 = (this->ring).items[2].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005c5f88:
      fVar30 = (this->ring).items[2].vtx.field_0.v[0];
      fVar24 = (this->ring).items[2].vtx.field_0.v[1];
      fVar27 = (this->ring).items[2].vtx.field_0.v[2];
      fVar22 = (this->ring).items[2].vtx.field_0.v[3];
    }
    else {
      fVar30 = ((this->ring).items[2].vtx.field_0.v[0] - fVar26) * fVar22;
      fVar24 = ((this->ring).items[2].vtx.field_0.v[1] - fVar28) * fVar22;
      fVar27 = ((this->ring).items[2].vtx.field_0.v[2] - fVar29) * fVar22;
      fVar22 = ((this->ring).items[2].vtx.field_0.v[3] - fVar25) * fVar22;
LAB_005c5af5:
      fVar30 = fVar30 + fVar26;
      fVar24 = fVar24 + fVar28;
      fVar27 = fVar27 + fVar29;
      fVar22 = fVar22 + fVar25;
    }
    patch->items[2].ring.items[2].vtx.field_0.v[0] = fVar30;
    patch->items[2].ring.items[2].vtx.field_0.v[1] = fVar24;
    patch->items[2].ring.items[2].vtx.field_0.v[2] = fVar27;
    patch->items[2].ring.items[2].vtx.field_0.v[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005c5f88;
    pvVar13 = (this->ring).items[2].ring.data;
    pvVar11 = pvVar13 + center_ring[0].field_0._0_8_ * 2;
    pvVar13 = pvVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar23 = ((this->ring).items[2].vtx.field_0.v[0] * 6.0 + (pvVar11->field_0).v[0] +
             (pvVar13->field_0).v[0]) * 0.125;
    fVar31 = ((this->ring).items[2].vtx.field_0.v[1] * 6.0 + (pvVar11->field_0).v[1] +
             (pvVar13->field_0).v[1]) * 0.125;
    fVar32 = ((this->ring).items[2].vtx.field_0.v[2] * 6.0 + (pvVar11->field_0).v[2] +
             (pvVar13->field_0).v[2]) * 0.125;
    fVar33 = ((this->ring).items[2].vtx.field_0.v[3] * 6.0 + (pvVar11->field_0).v[3] +
             (pvVar13->field_0).v[3]) * 0.125;
    patch->items[2].ring.items[2].vtx.field_0.v[0] = fVar23;
    patch->items[2].ring.items[2].vtx.field_0.v[1] = fVar31;
    patch->items[2].ring.items[2].vtx.field_0.v[2] = fVar32;
    patch->items[2].ring.items[2].vtx.field_0.v[3] = fVar33;
    pfVar12 = (this->ring).items[2].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar30 = pfVar12[center_ring[0].field_0._8_8_];
    fVar27 = (fVar22 * 3.0 + fVar30) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[2].ring.items[2].crease_weight.data[lVar16] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    }
    pfVar12[uVar7] = fVar24;
    fVar27 = (fVar30 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    if ((0x10 < uVar8 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[2].ring.items[2].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[2].ring.items[2].crease_weight.data[lVar16] =
             patch->items[2].ring.items[2].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[2].ring.items[2].crease_weight.data;
    }
    pfVar12[uVar8] = fVar24;
    fVar22 = (fVar22 + fVar30) * 0.5;
    if (fVar22 < 1.0) {
      fVar30 = (fVar23 - fVar26) * fVar22;
      fVar24 = (fVar31 - fVar28) * fVar22;
      fVar27 = (fVar32 - fVar29) * fVar22;
      fVar22 = (fVar33 - fVar25) * fVar22;
      goto LAB_005c5af5;
    }
  }
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[3].ring.items[3].vertex_level = (this->ring).items[3].vertex_level * 0.5;
  patch->items[3].ring.items[3].face_valence = (this->ring).items[3].face_valence;
  patch->items[3].ring.items[3].edge_valence = (this->ring).items[3].edge_valence;
  patch->items[3].ring.items[3].border_index = (this->ring).items[3].border_index;
  fVar22 = (this->ring).items[3].vertex_crease_weight + -1.0;
  if (fVar22 <= 0.0) {
    fVar22 = 0.0;
  }
  patch->items[3].ring.items[3].vertex_crease_weight = fVar22;
  patch->items[3].ring.items[3].eval_start_index = (this->ring).items[3].eval_start_index;
  patch->items[3].ring.items[3].eval_unique_identifier =
       (this->ring).items[3].eval_unique_identifier;
  pDVar2 = &patch->items[3].ring.items[3].ring;
  fVar22 = 0.0;
  fVar28 = 0.0;
  fVar29 = 0.0;
  fVar30 = 0.0;
  uVar19 = 0;
  for (uVar21 = 0; uVar9 = (ulong)(this->ring).items[3].face_valence, uVar21 < uVar9;
      uVar21 = uVar21 + 1) {
    uVar14 = (ulong)(this->ring).items[3].edge_valence;
    uVar15 = (this->ring).items[3].eval_start_index + uVar21;
    if (uVar15 < uVar9) {
      uVar9 = uVar19;
    }
    lVar16 = uVar15 - uVar9;
    uVar9 = uVar14;
    if ((ulong)(lVar16 * 2) < uVar14) {
      uVar9 = uVar19;
    }
    uVar15 = lVar16 * 2 + 1;
    uVar17 = uVar14;
    if (uVar15 < uVar14) {
      uVar17 = uVar19;
    }
    lVar10 = uVar15 - uVar17;
    uVar15 = lVar16 * 2 + 2;
    if (uVar15 < uVar14) {
      uVar14 = uVar19;
    }
    pvVar6 = (this->ring).items[3].ring.data;
    pvVar11 = pvVar6 + lVar10;
    pvVar13 = pvVar6 + (lVar16 * 2 - uVar9);
    pvVar6 = pvVar6 + (uVar15 - uVar14);
    fVar24 = ((pvVar13->field_0).v[0] + (pvVar6->field_0).v[0] +
             (this->ring).items[3].vtx.field_0.v[0] + (pvVar11->field_0).v[0]) * 0.25;
    fVar25 = ((pvVar13->field_0).v[1] + (pvVar6->field_0).v[1] +
             (this->ring).items[3].vtx.field_0.v[1] + (pvVar11->field_0).v[1]) * 0.25;
    fVar26 = ((pvVar13->field_0).v[2] + (pvVar6->field_0).v[2] +
             (this->ring).items[3].vtx.field_0.v[2] + (pvVar11->field_0).v[2]) * 0.25;
    fVar27 = ((pvVar13->field_0).v[3] + (pvVar6->field_0).v[3] +
             (this->ring).items[3].vtx.field_0.v[3] + (pvVar11->field_0).v[3]) * 0.25;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    if ((0x20 < lVar10 + 1U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[3].ring.items[3].ring.data = pvVar11;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar16);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar16);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[3].ring.items[3].ring.data;
    }
    pvVar11 = pvVar11 + lVar10;
    (pvVar11->field_0).v[0] = fVar24;
    (pvVar11->field_0).v[1] = fVar25;
    (pvVar11->field_0).v[2] = fVar26;
    (pvVar11->field_0).v[3] = fVar27;
    fVar22 = fVar22 + fVar24;
    fVar28 = fVar28 + fVar25;
    fVar29 = fVar29 + fVar26;
    fVar30 = fVar30 + fVar27;
  }
  pDVar1 = &patch->items[3].ring.items[3].crease_weight;
  uVar21 = 0;
  for (uVar19 = 0; uVar19 < uVar9; uVar19 = uVar19 + 1) {
    uVar15 = (this->ring).items[3].eval_start_index + uVar19;
    uVar14 = 0;
    if (uVar9 <= uVar15) {
      uVar14 = uVar9;
    }
    lVar16 = uVar15 - uVar14;
    fVar24 = (this->ring).items[3].crease_weight.data[lVar16];
    pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < lVar16 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar12;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        patch->items[3].ring.items[3].crease_weight.data[lVar10] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar10];
      }
      pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    }
    fVar25 = 0.0;
    if (0.0 <= fVar24 + -1.0) {
      fVar25 = fVar24 + -1.0;
    }
    pfVar12[lVar16] = fVar25;
    uVar9 = lVar16 * 2 - 1;
    if (uVar15 == uVar14) {
      uVar9 = (ulong)((this->ring).items[3].edge_valence - 1);
    }
    pvVar11 = (this->ring).items[3].ring.data + lVar16 * 2;
    fVar25 = (this->ring).items[3].vtx.field_0.v[0] + (pvVar11->field_0).v[0];
    fVar26 = (this->ring).items[3].vtx.field_0.v[1] + (pvVar11->field_0).v[1];
    fVar27 = (this->ring).items[3].vtx.field_0.v[2] + (pvVar11->field_0).v[2];
    fVar23 = (this->ring).items[3].vtx.field_0.v[3] + (pvVar11->field_0).v[3];
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    if ((0x20 < uVar9 + 1) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[3].ring.items[3].ring.data = pvVar11;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar11 = patch->items[3].ring.items[3].ring.data;
    }
    pvVar13 = pvVar11;
    if ((0x20 < lVar16 * 2 + 2U) &&
       ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar11 == pDVar2)) {
      pvVar13 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
      patch->items[3].ring.items[3].ring.data = pvVar13;
      for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
        puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
        uVar7 = puVar4[1];
        puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar7;
      }
      pvVar13 = patch->items[3].ring.items[3].ring.data;
    }
    uVar14 = lVar16 * 2 + 1;
    pvVar11 = pvVar11 + uVar9;
    pvVar6 = pvVar13 + uVar14;
    fVar31 = (pvVar11->field_0).v[0] + (pvVar6->field_0).v[0];
    fVar32 = (pvVar11->field_0).v[1] + (pvVar6->field_0).v[1];
    fVar33 = (pvVar11->field_0).v[2] + (pvVar6->field_0).v[2];
    fVar34 = (pvVar11->field_0).v[3] + (pvVar6->field_0).v[3];
    pvVar11 = (this->ring).items[3].ring.data + lVar16 * 2;
    fVar22 = fVar22 + (pvVar11->field_0).v[0];
    fVar28 = fVar28 + (pvVar11->field_0).v[1];
    fVar29 = fVar29 + (pvVar11->field_0).v[2];
    fVar30 = fVar30 + (pvVar11->field_0).v[3];
    if (0.0 < fVar24) {
      *(long *)((long)&center_ring[0].field_0 + uVar21 * 8) = lVar16;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[3].ring.items[3].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[3].ring.items[3].ring.data;
      }
      uVar21 = uVar21 + 1;
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = fVar25 * 0.5;
      (pvVar13->field_0).v[1] = fVar26 * 0.5;
      (pvVar13->field_0).v[2] = fVar27 * 0.5;
      (pvVar13->field_0).v[3] = fVar23 * 0.5;
      if (fVar24 < 1.0) {
        fVar31 = (fVar25 + fVar31) * 0.25;
        fVar32 = (fVar26 + fVar32) * 0.25;
        fVar33 = (fVar27 + fVar33) * 0.25;
        fVar34 = (fVar23 + fVar34) * 0.25;
        fStack_284 = (fVar26 * 0.5 - fVar32) * fVar24 + fVar32;
        local_288 = (fVar25 * 0.5 - fVar31) * fVar24 + fVar31;
        fStack_280 = (fVar27 * 0.5 - fVar33) * fVar24 + fVar33;
        fStack_27c = (fVar23 * 0.5 - fVar34) * fVar24 + fVar34;
        pvVar13 = patch->items[3].ring.items[3].ring.data;
        if ((0x20 < uVar14) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
          pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          patch->items[3].ring.items[3].ring.data = pvVar11;
          for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
            puVar4 = (undefined8 *)
                     ((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10);
            uVar7 = puVar4[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
            *puVar3 = *puVar4;
            puVar3[1] = uVar7;
          }
          pvVar13 = patch->items[3].ring.items[3].ring.data;
        }
        goto LAB_005c4489;
      }
    }
    else {
      local_288 = (fVar25 + fVar31) * 0.25;
      fStack_284 = (fVar26 + fVar32) * 0.25;
      fStack_280 = (fVar27 + fVar33) * 0.25;
      fStack_27c = (fVar23 + fVar34) * 0.25;
      if ((0x20 < uVar14) &&
         ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar13 == pDVar2)) {
        pvVar11 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
        patch->items[3].ring.items[3].ring.data = pvVar11;
        for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x10) {
          puVar4 = (undefined8 *)((long)&patch->items[3].ring.items[3].ring.arr[0].field_0 + lVar10)
          ;
          uVar7 = puVar4[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[3].ring.items[3].ring.data)->field_0 + lVar10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar7;
        }
        pvVar13 = patch->items[3].ring.items[3].ring.data;
LAB_005c4489:
      }
      pvVar13 = pvVar13 + lVar16 * 2;
      (pvVar13->field_0).v[0] = local_288;
      (pvVar13->field_0).v[1] = fStack_284;
      (pvVar13->field_0).v[2] = fStack_280;
      (pvVar13->field_0).v[3] = fStack_27c;
    }
    uVar9 = (ulong)(this->ring).items[3].face_valence;
  }
  fVar25 = 1.0 / (float)uVar9;
  fVar24 = (float)uVar9 + -2.0;
  fVar26 = (fVar22 * fVar25 + fVar24 * (this->ring).items[3].vtx.field_0.v[0]) * fVar25;
  fVar28 = (fVar28 * fVar25 + fVar24 * (this->ring).items[3].vtx.field_0.v[1]) * fVar25;
  fVar29 = (fVar29 * fVar25 + fVar24 * (this->ring).items[3].vtx.field_0.v[2]) * fVar25;
  fVar25 = (fVar30 * fVar25 + fVar24 * (this->ring).items[3].vtx.field_0.v[3]) * fVar25;
  patch->items[3].ring.items[3].vtx.field_0.v[0] = fVar26;
  patch->items[3].ring.items[3].vtx.field_0.v[1] = fVar28;
  patch->items[3].ring.items[3].vtx.field_0.v[2] = fVar29;
  patch->items[3].ring.items[3].vtx.field_0.v[3] = fVar25;
  fVar22 = (this->ring).items[3].vertex_crease_weight;
  if (0.0 < fVar22) {
    if (1.0 <= fVar22) {
LAB_005c5f9c:
      fVar30 = (this->ring).items[3].vtx.field_0.v[0];
      fVar24 = (this->ring).items[3].vtx.field_0.v[1];
      fVar27 = (this->ring).items[3].vtx.field_0.v[2];
      fVar22 = (this->ring).items[3].vtx.field_0.v[3];
    }
    else {
      fVar30 = ((this->ring).items[3].vtx.field_0.v[0] - fVar26) * fVar22;
      fVar24 = ((this->ring).items[3].vtx.field_0.v[1] - fVar28) * fVar22;
      fVar27 = ((this->ring).items[3].vtx.field_0.v[2] - fVar29) * fVar22;
      fVar22 = ((this->ring).items[3].vtx.field_0.v[3] - fVar25) * fVar22;
LAB_005c5b1c:
      fVar30 = fVar30 + fVar26;
      fVar24 = fVar24 + fVar28;
      fVar27 = fVar27 + fVar29;
      fVar22 = fVar22 + fVar25;
    }
    patch->items[3].ring.items[3].vtx.field_0.v[0] = fVar30;
    patch->items[3].ring.items[3].vtx.field_0.v[1] = fVar24;
    patch->items[3].ring.items[3].vtx.field_0.v[2] = fVar27;
    patch->items[3].ring.items[3].vtx.field_0.v[3] = fVar22;
  }
  else if (1 < uVar21) {
    if (uVar21 != 2) goto LAB_005c5f9c;
    pvVar13 = (this->ring).items[3].ring.data;
    pvVar11 = pvVar13 + center_ring[0].field_0._0_8_ * 2;
    pvVar13 = pvVar13 + center_ring[0].field_0._8_8_ * 2;
    fVar23 = ((this->ring).items[3].vtx.field_0.v[0] * 6.0 + (pvVar11->field_0).v[0] +
             (pvVar13->field_0).v[0]) * 0.125;
    fVar31 = ((this->ring).items[3].vtx.field_0.v[1] * 6.0 + (pvVar11->field_0).v[1] +
             (pvVar13->field_0).v[1]) * 0.125;
    fVar32 = ((this->ring).items[3].vtx.field_0.v[2] * 6.0 + (pvVar11->field_0).v[2] +
             (pvVar13->field_0).v[2]) * 0.125;
    fVar33 = ((this->ring).items[3].vtx.field_0.v[3] * 6.0 + (pvVar11->field_0).v[3] +
             (pvVar13->field_0).v[3]) * 0.125;
    patch->items[3].ring.items[3].vtx.field_0.v[0] = fVar23;
    patch->items[3].ring.items[3].vtx.field_0.v[1] = fVar31;
    patch->items[3].ring.items[3].vtx.field_0.v[2] = fVar32;
    patch->items[3].ring.items[3].vtx.field_0.v[3] = fVar33;
    pfVar12 = (this->ring).items[3].crease_weight.data;
    fVar22 = pfVar12[center_ring[0].field_0._0_8_];
    fVar30 = pfVar12[center_ring[0].field_0._8_8_];
    fVar27 = (fVar22 * 3.0 + fVar30) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._0_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[3].ring.items[3].crease_weight.data[lVar16] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    }
    pfVar12[center_ring[0].field_0._0_8_] = fVar24;
    fVar27 = (fVar30 * 3.0 + fVar22) * 0.25 + -1.0;
    fVar24 = 0.0;
    if (0.0 <= fVar27) {
      fVar24 = fVar27;
    }
    pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    if ((0x10 < center_ring[0].field_0._8_8_ + 1) &&
       ((DynamicStackArray<float,_16UL,_64UL> *)pfVar12 == pDVar1)) {
      pfVar12 = (float *)operator_new__(0x100);
      patch->items[3].ring.items[3].crease_weight.data = pfVar12;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        patch->items[3].ring.items[3].crease_weight.data[lVar16] =
             patch->items[3].ring.items[3].crease_weight.arr[lVar16];
      }
      pfVar12 = patch->items[3].ring.items[3].crease_weight.data;
    }
    pfVar12[center_ring[0].field_0._8_8_] = fVar24;
    fVar22 = (fVar22 + fVar30) * 0.5;
    if (fVar22 < 1.0) {
      fVar30 = (fVar23 - fVar26) * fVar22;
      fVar24 = (fVar31 - fVar28) * fVar22;
      fVar27 = (fVar32 - fVar29) * fVar22;
      fVar22 = (fVar33 - fVar25) * fVar22;
      goto LAB_005c5b1c;
    }
  }
  fVar22 = (this->ring).items[0].edge_level * 0.5;
  patch->items[0].ring.items[0].edge_level = fVar22;
  patch->items[0].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[0].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[0].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  patch->items[1].ring.items[0].edge_level = (this->ring).items[0].edge_level * 0.5;
  patch->items[1].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[1].ring.items[2].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[1].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[2].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[2].ring.items[1].edge_level = (this->ring).items[1].edge_level * 0.5;
  patch->items[2].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[2].ring.items[3].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[0].edge_level =
       ((this->ring).items[0].edge_level + (this->ring).items[2].edge_level) * 0.25;
  patch->items[3].ring.items[1].edge_level =
       ((this->ring).items[1].edge_level + (this->ring).items[3].edge_level) * 0.25;
  patch->items[3].ring.items[2].edge_level = (this->ring).items[2].edge_level * 0.5;
  patch->items[3].ring.items[3].edge_level = (this->ring).items[3].edge_level * 0.5;
  iVar5 = (this->ring).items[0].border_index;
  uVar18 = (this->ring).items[0].edge_valence;
  uVar20 = (this->ring).items[1].face_valence;
  patch->items[0].ring.items[1].vertex_level = fVar22;
  patch->items[1].ring.items[0].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[0].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[1].border_index = 2;
    patch->items[0].ring.items[1].face_valence = 3;
    patch->items[1].ring.items[0].border_index = 4;
    patch->items[1].ring.items[0].face_valence = 3;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar8;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data +
              (long)patch->items[0].ring.items[0].border_index + 1;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[2] = fVar22;
    *patch->items[1].ring.items[0].crease_weight.data = fVar22;
    fVar22 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar22;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar20 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar20 < uVar18) {
      patch->items[0].ring.items[1].eval_start_index = 2;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_005c4b35;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_005c4b6c:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar18;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar18;
  }
  else {
    patch->items[0].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[1].border_index = -1;
    patch->items[0].ring.items[1].face_valence = 4;
    patch->items[1].ring.items[0].border_index = -1;
    patch->items[1].ring.items[0].face_valence = 4;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[0].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[1].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[1].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[0].vtx.field_0 + 8) = uVar8;
    patch->items[0].ring.items[1].vertex_crease_weight = 0.0;
    patch->items[1].ring.items[0].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[4].field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 1);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data +
              (patch->items[0].ring.items[0].edge_valence - 2);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[0].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[0].ring.items[1].crease_weight.data = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[1].ring.items[1].crease_weight.data[1];
    patch->items[0].ring.items[1].crease_weight.data[3] = fVar22;
    *patch->items[1].ring.items[0].crease_weight.data = fVar22;
    patch->items[0].ring.items[1].crease_weight.data[2] = 0.0;
    patch->items[1].ring.items[0].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[0].ring.items[0].crease_weight.data;
    patch->items[0].ring.items[1].crease_weight.data[1] = fVar22;
    patch->items[1].ring.items[0].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[0].ring.items[0].eval_unique_identifier;
    uVar20 = patch->items[1].ring.items[1].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[0].ring.items[1].eval_start_index = 3;
      patch->items[1].ring.items[0].eval_start_index = 0;
      goto LAB_005c4b6c;
    }
    patch->items[0].ring.items[1].eval_start_index = 1;
    patch->items[1].ring.items[0].eval_start_index = 2;
LAB_005c4b35:
    patch->items[0].ring.items[1].eval_unique_identifier = uVar20;
    patch->items[1].ring.items[0].eval_unique_identifier = uVar20;
  }
  iVar5 = (this->ring).items[1].border_index;
  uVar18 = (this->ring).items[1].edge_valence;
  uVar20 = (this->ring).items[2].face_valence;
  fVar22 = patch->items[1].ring.items[1].edge_level;
  patch->items[1].ring.items[2].vertex_level = fVar22;
  patch->items[2].ring.items[1].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[1].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[1].edge_valence = 6;
    patch->items[1].ring.items[2].border_index = 2;
    patch->items[1].ring.items[2].face_valence = 3;
    patch->items[2].ring.items[1].border_index = 4;
    patch->items[2].ring.items[1].face_valence = 3;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar8;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data +
              (long)patch->items[1].ring.items[1].border_index + 1;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[2] = fVar22;
    *patch->items[2].ring.items[1].crease_weight.data = fVar22;
    fVar22 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar22;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar20 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar20 < uVar18) {
      patch->items[1].ring.items[2].eval_start_index = 2;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_005c4f6b;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_005c4fa2:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar18;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar18;
  }
  else {
    patch->items[1].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[1].edge_valence = 8;
    patch->items[1].ring.items[2].border_index = -1;
    patch->items[1].ring.items[2].face_valence = 4;
    patch->items[2].ring.items[1].border_index = -1;
    patch->items[2].ring.items[1].face_valence = 4;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[1].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[1].ring.items[2].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[2].ring.items[1].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[1].vtx.field_0 + 8) = uVar8;
    patch->items[1].ring.items[2].vertex_crease_weight = 0.0;
    patch->items[2].ring.items[1].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[4].field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 1);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data +
              (patch->items[1].ring.items[1].edge_valence - 2);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[1].ring.items[1].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[1].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[1].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[1].ring.items[2].crease_weight.data = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[2].ring.items[2].crease_weight.data[1];
    patch->items[1].ring.items[2].crease_weight.data[3] = fVar22;
    *patch->items[2].ring.items[1].crease_weight.data = fVar22;
    patch->items[1].ring.items[2].crease_weight.data[2] = 0.0;
    patch->items[2].ring.items[1].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[1].ring.items[1].crease_weight.data;
    patch->items[1].ring.items[2].crease_weight.data[1] = fVar22;
    patch->items[2].ring.items[1].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[1].ring.items[1].eval_unique_identifier;
    uVar20 = patch->items[2].ring.items[2].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[1].ring.items[2].eval_start_index = 3;
      patch->items[2].ring.items[1].eval_start_index = 0;
      goto LAB_005c4fa2;
    }
    patch->items[1].ring.items[2].eval_start_index = 1;
    patch->items[2].ring.items[1].eval_start_index = 2;
LAB_005c4f6b:
    patch->items[1].ring.items[2].eval_unique_identifier = uVar20;
    patch->items[2].ring.items[1].eval_unique_identifier = uVar20;
  }
  iVar5 = (this->ring).items[2].border_index;
  uVar18 = (this->ring).items[2].edge_valence;
  uVar20 = (this->ring).items[3].face_valence;
  fVar22 = patch->items[2].ring.items[2].edge_level;
  patch->items[2].ring.items[3].vertex_level = fVar22;
  patch->items[3].ring.items[2].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[2].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[2].edge_valence = 6;
    patch->items[2].ring.items[3].border_index = 2;
    patch->items[2].ring.items[3].face_valence = 3;
    patch->items[3].ring.items[2].border_index = 4;
    patch->items[3].ring.items[2].face_valence = 3;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar8;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data +
              (long)patch->items[2].ring.items[2].border_index + 1;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[2] = fVar22;
    *patch->items[3].ring.items[2].crease_weight.data = fVar22;
    fVar22 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar22;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar20 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar20 < uVar18) {
      patch->items[2].ring.items[3].eval_start_index = 2;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_005c53a1;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_005c53d8:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar18;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar18;
  }
  else {
    patch->items[2].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[2].edge_valence = 8;
    patch->items[2].ring.items[3].border_index = -1;
    patch->items[2].ring.items[3].face_valence = 4;
    patch->items[3].ring.items[2].border_index = -1;
    patch->items[3].ring.items[2].face_valence = 4;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[2].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[2].ring.items[3].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[3].ring.items[2].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[2].vtx.field_0 + 8) = uVar8;
    patch->items[2].ring.items[3].vertex_crease_weight = 0.0;
    patch->items[3].ring.items[2].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[4].field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 1);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data +
              (patch->items[2].ring.items[2].edge_valence - 2);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[2].ring.items[2].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[2].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[2].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[2].ring.items[3].crease_weight.data = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[3].ring.items[3].crease_weight.data[1];
    patch->items[2].ring.items[3].crease_weight.data[3] = fVar22;
    *patch->items[3].ring.items[2].crease_weight.data = fVar22;
    patch->items[2].ring.items[3].crease_weight.data[2] = 0.0;
    patch->items[3].ring.items[2].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[2].ring.items[2].crease_weight.data;
    patch->items[2].ring.items[3].crease_weight.data[1] = fVar22;
    patch->items[3].ring.items[2].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[2].ring.items[2].eval_unique_identifier;
    uVar20 = patch->items[3].ring.items[3].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[2].ring.items[3].eval_start_index = 3;
      patch->items[3].ring.items[2].eval_start_index = 0;
      goto LAB_005c53d8;
    }
    patch->items[2].ring.items[3].eval_start_index = 1;
    patch->items[3].ring.items[2].eval_start_index = 2;
LAB_005c53a1:
    patch->items[2].ring.items[3].eval_unique_identifier = uVar20;
    patch->items[3].ring.items[2].eval_unique_identifier = uVar20;
  }
  iVar5 = (this->ring).items[3].border_index;
  uVar18 = (this->ring).items[3].edge_valence;
  uVar20 = (this->ring).items[0].face_valence;
  fVar22 = patch->items[3].ring.items[3].edge_level;
  patch->items[3].ring.items[0].vertex_level = fVar22;
  patch->items[0].ring.items[3].vertex_level = fVar22;
  if (((ulong)uVar18 - 2 == (long)iVar5) || (uVar20 < 3)) {
    patch->items[3].ring.items[0].edge_valence = 6;
    patch->items[0].ring.items[3].edge_valence = 6;
    patch->items[3].ring.items[0].border_index = 2;
    patch->items[3].ring.items[0].face_valence = 3;
    patch->items[0].ring.items[3].border_index = 4;
    patch->items[0].ring.items[3].face_valence = 3;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar8;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data +
              (long)patch->items[3].ring.items[3].border_index + 1;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[2] = fVar22;
    *patch->items[0].ring.items[3].crease_weight.data = fVar22;
    fVar22 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar22;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar20 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[3].ring.items[0].eval_start_index = 1;
      patch->items[0].ring.items[3].eval_start_index = 2;
      goto LAB_005c57c5;
    }
    patch->items[3].ring.items[0].eval_start_index = 2;
    patch->items[0].ring.items[3].eval_start_index = 0;
  }
  else {
    patch->items[3].ring.items[0].edge_valence = 8;
    patch->items[0].ring.items[3].edge_valence = 8;
    patch->items[3].ring.items[0].border_index = -1;
    patch->items[3].ring.items[0].face_valence = 4;
    patch->items[0].ring.items[3].border_index = -1;
    patch->items[0].ring.items[3].face_valence = 4;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    *(undefined8 *)&patch->items[3].ring.items[0].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[3].ring.items[0].vtx.field_0 + 8) = uVar8;
    *(undefined8 *)&patch->items[0].ring.items[3].vtx.field_0 = uVar7;
    *(undefined8 *)((long)&patch->items[0].ring.items[3].vtx.field_0 + 8) = uVar8;
    patch->items[3].ring.items[0].vertex_crease_weight = 0.0;
    patch->items[0].ring.items[3].vertex_crease_weight = 0.0;
    uVar7 = *(undefined8 *)&pvVar11[1].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[1].field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11->field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11->field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[0].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[4].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[4].field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[7].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[7].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 1);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[6].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[6].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data +
              (patch->items[3].ring.items[3].edge_valence - 2);
    uVar7 = *(undefined8 *)&pvVar11->field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11->field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[5].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[5].field_0 + 8) = uVar8;
    uVar7 = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
    uVar8 = *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[2].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[2].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[4].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[4].field_0 + 8) = uVar8;
    pvVar11 = patch->items[3].ring.items[3].ring.data;
    uVar7 = *(undefined8 *)&pvVar11[2].field_0;
    uVar8 = *(undefined8 *)((long)&pvVar11[2].field_0 + 8);
    pvVar11 = patch->items[3].ring.items[0].ring.data;
    *(undefined8 *)&pvVar11[1].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[1].field_0 + 8) = uVar8;
    pvVar11 = patch->items[0].ring.items[3].ring.data;
    *(undefined8 *)&pvVar11[3].field_0 = uVar7;
    *(undefined8 *)((long)&pvVar11[3].field_0 + 8) = uVar8;
    *patch->items[3].ring.items[0].crease_weight.data = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[1] = 0.0;
    fVar22 = patch->items[0].ring.items[0].crease_weight.data[1];
    patch->items[3].ring.items[0].crease_weight.data[3] = fVar22;
    *patch->items[0].ring.items[3].crease_weight.data = fVar22;
    patch->items[3].ring.items[0].crease_weight.data[2] = 0.0;
    patch->items[0].ring.items[3].crease_weight.data[3] = 0.0;
    fVar22 = *patch->items[3].ring.items[3].crease_weight.data;
    patch->items[3].ring.items[0].crease_weight.data[1] = fVar22;
    patch->items[0].ring.items[3].crease_weight.data[2] = fVar22;
    uVar18 = patch->items[3].ring.items[3].eval_unique_identifier;
    uVar20 = patch->items[0].ring.items[0].eval_unique_identifier;
    if (uVar18 <= uVar20) {
      patch->items[3].ring.items[0].eval_start_index = 3;
      patch->items[0].ring.items[3].eval_start_index = 0;
LAB_005c57c5:
      patch->items[3].ring.items[0].eval_unique_identifier = uVar18;
      patch->items[0].ring.items[3].eval_unique_identifier = uVar18;
      goto LAB_005c57d1;
    }
    patch->items[3].ring.items[0].eval_start_index = 1;
    patch->items[0].ring.items[3].eval_start_index = 2;
  }
  patch->items[3].ring.items[0].eval_unique_identifier = uVar20;
  patch->items[0].ring.items[3].eval_unique_identifier = uVar20;
LAB_005c57d1:
  fVar22 = ((this->ring).items[0].vtx.field_0.v[0] + (this->ring).items[1].vtx.field_0.v[0] +
            (this->ring).items[2].vtx.field_0.v[0] + (this->ring).items[3].vtx.field_0.v[0]) * 0.25;
  fVar28 = ((this->ring).items[0].vtx.field_0.v[1] + (this->ring).items[1].vtx.field_0.v[1] +
            (this->ring).items[2].vtx.field_0.v[1] + (this->ring).items[3].vtx.field_0.v[1]) * 0.25;
  fVar29 = ((this->ring).items[0].vtx.field_0.v[2] + (this->ring).items[1].vtx.field_0.v[2] +
            (this->ring).items[2].vtx.field_0.v[2] + (this->ring).items[3].vtx.field_0.v[2]) * 0.25;
  fVar30 = ((this->ring).items[0].vtx.field_0.v[3] + (this->ring).items[1].vtx.field_0.v[3] +
            (this->ring).items[2].vtx.field_0.v[3] + (this->ring).items[3].vtx.field_0.v[3]) * 0.25;
  pvVar11 = patch->items[3].ring.items[3].ring.data;
  center_ring[0].field_0._0_8_ = *(undefined8 *)&pvVar11->field_0;
  center_ring[0].field_0._8_8_ = *(undefined8 *)((long)&pvVar11->field_0 + 8);
  center_ring[7].field_0._0_8_ = *(undefined8 *)&patch->items[3].ring.items[3].vtx.field_0;
  center_ring[7].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[3].ring.items[3].vtx.field_0 + 8);
  pvVar11 = patch->items[2].ring.items[2].ring.data;
  center_ring[6].field_0._0_8_ = *(undefined8 *)&pvVar11->field_0;
  center_ring[6].field_0._8_8_ = *(undefined8 *)((long)&pvVar11->field_0 + 8);
  center_ring[5].field_0._0_8_ = *(undefined8 *)&patch->items[2].ring.items[2].vtx.field_0;
  center_ring[5].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[2].ring.items[2].vtx.field_0 + 8);
  pvVar11 = patch->items[1].ring.items[1].ring.data;
  center_ring[4].field_0._0_8_ = *(undefined8 *)&pvVar11->field_0;
  center_ring[4].field_0._8_8_ = *(undefined8 *)((long)&pvVar11->field_0 + 8);
  center_ring[3].field_0._0_8_ = *(undefined8 *)&patch->items[1].ring.items[1].vtx.field_0;
  center_ring[3].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[1].ring.items[1].vtx.field_0 + 8);
  pvVar11 = patch->items[0].ring.items[0].ring.data;
  center_ring[2].field_0._0_8_ = *(undefined8 *)&pvVar11->field_0;
  center_ring[2].field_0._8_8_ = *(undefined8 *)((long)&pvVar11->field_0 + 8);
  center_ring[1].field_0._0_8_ = *(undefined8 *)&patch->items[0].ring.items[0].vtx.field_0;
  center_ring[1].field_0._8_8_ =
       *(undefined8 *)((long)&patch->items[0].ring.items[0].vtx.field_0 + 8);
  patch->items[0].ring.items[2].vertex_level = 0.0;
  patch->items[0].ring.items[2].border_index = -1;
  patch->items[0].ring.items[2].face_valence = 4;
  patch->items[0].ring.items[2].edge_valence = 8;
  patch->items[0].ring.items[2].vertex_crease_weight = 0.0;
  patch->items[0].ring.items[2].vtx.field_0.v[0] = fVar22;
  patch->items[0].ring.items[2].vtx.field_0.v[1] = fVar28;
  patch->items[0].ring.items[2].vtx.field_0.v[2] = fVar29;
  patch->items[0].ring.items[2].vtx.field_0.v[3] = fVar30;
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    uVar7 = *(undefined8 *)((long)&center_ring[0].field_0 + lVar16 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[0].ring.items[2].ring.data)->field_0 + lVar16);
    *puVar3 = *(undefined8 *)((long)&center_ring[0].field_0 + lVar16);
    puVar3[1] = uVar7;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[0].ring.items[2].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[0].ring.items[2].eval_start_index = 4;
  uVar18 = patch->items[0].ring.items[2].face_valence;
  if (uVar18 < 5) {
    patch->items[0].ring.items[2].eval_start_index = 4 - uVar18;
  }
  patch->items[0].ring.items[2].eval_unique_identifier = 0;
  patch->items[1].ring.items[3].vertex_level = 0.0;
  patch->items[1].ring.items[3].border_index = -1;
  patch->items[1].ring.items[3].face_valence = 4;
  patch->items[1].ring.items[3].edge_valence = 8;
  patch->items[1].ring.items[3].vertex_crease_weight = 0.0;
  patch->items[1].ring.items[3].vtx.field_0.v[0] = fVar22;
  patch->items[1].ring.items[3].vtx.field_0.v[1] = fVar28;
  patch->items[1].ring.items[3].vtx.field_0.v[2] = fVar29;
  patch->items[1].ring.items[3].vtx.field_0.v[3] = fVar30;
  lVar10 = 0;
  for (lVar16 = 2; lVar16 != 10; lVar16 = lVar16 + 1) {
    uVar21 = (ulong)(((uint)lVar16 & 7) << 4);
    uVar7 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[1].ring.items[3].ring.data)->field_0 + lVar10);
    *puVar3 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21);
    puVar3[1] = uVar7;
    lVar10 = lVar10 + 0x10;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[1].ring.items[3].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[1].ring.items[3].eval_start_index = 3;
  uVar18 = patch->items[1].ring.items[3].face_valence;
  if (uVar18 < 4) {
    patch->items[1].ring.items[3].eval_start_index = 3 - uVar18;
  }
  patch->items[1].ring.items[3].eval_unique_identifier = 0;
  patch->items[2].ring.items[0].vertex_level = 0.0;
  patch->items[2].ring.items[0].border_index = -1;
  patch->items[2].ring.items[0].face_valence = 4;
  patch->items[2].ring.items[0].edge_valence = 8;
  patch->items[2].ring.items[0].vertex_crease_weight = 0.0;
  patch->items[2].ring.items[0].vtx.field_0.v[0] = fVar22;
  patch->items[2].ring.items[0].vtx.field_0.v[1] = fVar28;
  patch->items[2].ring.items[0].vtx.field_0.v[2] = fVar29;
  patch->items[2].ring.items[0].vtx.field_0.v[3] = fVar30;
  lVar16 = 0;
  for (uVar21 = 0; uVar21 != 8; uVar21 = uVar21 + 1) {
    uVar7 = *(undefined8 *)((long)&center_ring[uVar21 ^ 4].field_0 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[2].ring.items[0].ring.data)->field_0 + lVar16);
    *puVar3 = *(undefined8 *)&center_ring[uVar21 ^ 4].field_0;
    puVar3[1] = uVar7;
    lVar16 = lVar16 + 0x10;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[2].ring.items[0].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[2].ring.items[0].eval_start_index = 2;
  uVar18 = patch->items[2].ring.items[0].face_valence;
  if (uVar18 < 3) {
    patch->items[2].ring.items[0].eval_start_index = 2 - uVar18;
  }
  patch->items[2].ring.items[0].eval_unique_identifier = 0;
  patch->items[3].ring.items[1].vertex_level = 0.0;
  patch->items[3].ring.items[1].border_index = -1;
  patch->items[3].ring.items[1].face_valence = 4;
  patch->items[3].ring.items[1].edge_valence = 8;
  patch->items[3].ring.items[1].vertex_crease_weight = 0.0;
  patch->items[3].ring.items[1].vtx.field_0.v[0] = fVar22;
  patch->items[3].ring.items[1].vtx.field_0.v[1] = fVar28;
  patch->items[3].ring.items[1].vtx.field_0.v[2] = fVar29;
  patch->items[3].ring.items[1].vtx.field_0.v[3] = fVar30;
  lVar10 = 0;
  for (lVar16 = 6; lVar16 != 0xe; lVar16 = lVar16 + 1) {
    uVar21 = (ulong)(((uint)lVar16 & 7) << 4);
    uVar7 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21 + 8);
    puVar3 = (undefined8 *)((long)&(patch->items[3].ring.items[1].ring.data)->field_0 + lVar10);
    *puVar3 = *(undefined8 *)((long)&center_ring[0].field_0 + uVar21);
    puVar3[1] = uVar7;
    lVar10 = lVar10 + 0x10;
  }
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    patch->items[3].ring.items[1].crease_weight.data[lVar16] = 0.0;
  }
  patch->items[3].ring.items[1].eval_start_index = 1;
  uVar18 = patch->items[3].ring.items[1].face_valence;
  if (uVar18 < 2) {
    patch->items[3].ring.items[1].eval_start_index = 1 - uVar18;
  }
  patch->items[3].ring.items[1].eval_unique_identifier = 0;
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatchT,4>& patch) const
    {
      ring[0].subdivide(patch[0].ring[0]);
      ring[1].subdivide(patch[1].ring[1]);
      ring[2].subdivide(patch[2].ring[2]);
      ring[3].subdivide(patch[3].ring[3]);
      
      patch[0].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[0].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[0].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[0].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      patch[1].ring[0].edge_level = 0.5f*ring[0].edge_level;
      patch[1].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[1].ring[2].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[1].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[2].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[2].ring[1].edge_level = 0.5f*ring[1].edge_level;
      patch[2].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[2].ring[3].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      
      patch[3].ring[0].edge_level = 0.25f*(ring[0].edge_level+ring[2].edge_level);
      patch[3].ring[1].edge_level = 0.25f*(ring[1].edge_level+ring[3].edge_level);
      patch[3].ring[2].edge_level = 0.5f*ring[2].edge_level;
      patch[3].ring[3].edge_level = 0.5f*ring[3].edge_level;
      
      const bool regular0 = ring[0].has_last_face() && ring[1].face_valence > 2;
      if (likely(regular0))
        init_regular(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      else
        init_border(patch[0].ring[0],patch[1].ring[1],patch[0].ring[1],patch[1].ring[0]);
      
      const bool regular1 = ring[1].has_last_face() && ring[2].face_valence > 2;
      if (likely(regular1))
        init_regular(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      else
        init_border(patch[1].ring[1],patch[2].ring[2],patch[1].ring[2],patch[2].ring[1]);
      
      const bool regular2 = ring[2].has_last_face() && ring[3].face_valence > 2;
      if (likely(regular2))
        init_regular(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      else
        init_border(patch[2].ring[2],patch[3].ring[3],patch[2].ring[3],patch[3].ring[2]);
      
      const bool regular3 = ring[3].has_last_face() && ring[0].face_valence > 2;
      if (likely(regular3))
        init_regular(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      else
        init_border(patch[3].ring[3],patch[0].ring[0],patch[3].ring[0],patch[0].ring[3]);
      
      Vertex_t center = (ring[0].vtx + ring[1].vtx + ring[2].vtx + ring[3].vtx) * 0.25f;

      Vertex_t center_ring[8];
      center_ring[0] = (Vertex_t)patch[3].ring[3].ring[0];
      center_ring[7] = (Vertex_t)patch[3].ring[3].vtx;
      center_ring[6] = (Vertex_t)patch[2].ring[2].ring[0];
      center_ring[5] = (Vertex_t)patch[2].ring[2].vtx;
      center_ring[4] = (Vertex_t)patch[1].ring[1].ring[0];
      center_ring[3] = (Vertex_t)patch[1].ring[1].vtx;
      center_ring[2] = (Vertex_t)patch[0].ring[0].ring[0];
      center_ring[1] = (Vertex_t)patch[0].ring[0].vtx;
      
      init_regular(center,center_ring,0,patch[0].ring[2]);
      init_regular(center,center_ring,2,patch[1].ring[3]);
      init_regular(center,center_ring,4,patch[2].ring[0]);
      init_regular(center,center_ring,6,patch[3].ring[1]);
      
      assert(patch[0].verify());
      assert(patch[1].verify());
      assert(patch[2].verify());
      assert(patch[3].verify());
    }